

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O3

void __thiscall MockSupport::failTestWithOutOfOrderCalls(MockSupport *this)

{
  int iVar1;
  MockSupport *node;
  MockSupport *pMVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  MockExpectedCallsList expectationsList;
  MockCallOrderFailure failure;
  MockExpectedCallsList local_90;
  TestFailure local_80;
  
  MockExpectedCallsList::MockExpectedCallsList(&local_90);
  MockExpectedCallsList::addExpectations(&local_90,&this->expectations_);
  pMVar3 = (MockSupport *)&this->data_;
  node = (MockSupport *)MockNamedValueList::begin((MockNamedValueList *)pMVar3);
  while (node != (MockSupport *)0x0) {
    pMVar2 = getMockSupport(pMVar3,(MockNamedValueListNode *)node);
    if (pMVar2 != (MockSupport *)0x0) {
      pMVar3 = getMockSupport(pMVar3,(MockNamedValueListNode *)node);
      MockExpectedCallsList::addExpectations(&local_90,&pMVar3->expectations_);
    }
    pMVar2 = (MockSupport *)MockNamedValueListNode::next((MockNamedValueListNode *)node);
    pMVar3 = node;
    node = pMVar2;
  }
  iVar1 = (*this->activeReporter_->_vptr_MockFailureReporter[3])();
  MockCallOrderFailure::MockCallOrderFailure
            ((MockCallOrderFailure *)&local_80,(UtestShell *)CONCAT44(extraout_var,iVar1),&local_90)
  ;
  (*this->_vptr_MockSupport[0x31])(this,&local_80);
  TestFailure::~TestFailure(&local_80);
  MockExpectedCallsList::~MockExpectedCallsList(&local_90);
  return;
}

Assistant:

void MockSupport::failTestWithOutOfOrderCalls()
{
    MockExpectedCallsList expectationsList;
    expectationsList.addExpectations(expectations_);

    for(MockNamedValueListNode *p = data_.begin();p;p = p->next())
        if(getMockSupport(p))
            expectationsList.addExpectations(getMockSupport(p)->expectations_);

    MockCallOrderFailure failure(activeReporter_->getTestToFail(), expectationsList);
    failTest(failure);
}